

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<FBX::Mesh> __thiscall FBX::Parser::parseMesh(Parser *this,Node *node,Vector3 up)

{
  bool bVar1;
  Mesh *this_00;
  reference ppPVar2;
  element_type *peVar3;
  reference pVVar4;
  Node *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<FBX::Mesh> sVar5;
  Vector3 v;
  Vector3 *vertex;
  iterator __end1_1;
  iterator __begin1_1;
  vector<FBX::Vector3,_std::allocator<FBX::Vector3>_> *__range1_1;
  Process **process;
  iterator __end1;
  iterator __begin1;
  set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *__range1;
  Node *node_local;
  Parser *this_local;
  Vector3 up_local;
  shared_ptr<FBX::Mesh> *mesh;
  
  this_00 = (Mesh *)operator_new(0x70);
  Mesh::Mesh(this_00,in_RDX);
  std::shared_ptr<FBX::Mesh>::shared_ptr<FBX::Mesh,void>((shared_ptr<FBX::Mesh> *)this,this_00);
  __end1 = std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::
           begin((set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *)
                 &node->propertyLength);
  process = (Process **)
            std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::
            end((set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *)
                &node->propertyLength);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&process), bVar1) {
    ppPVar2 = std::_Rb_tree_const_iterator<FBX::Process_*>::operator*(&__end1);
    (*(*ppPVar2)->_vptr_Process[2])(*ppPVar2,this);
    std::_Rb_tree_const_iterator<FBX::Process_*>::operator++(&__end1);
  }
  peVar3 = std::__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  __end1_1 = std::vector<FBX::Vector3,_std::allocator<FBX::Vector3>_>::begin(&peVar3->vertices);
  vertex = (Vector3 *)
           std::vector<FBX::Vector3,_std::allocator<FBX::Vector3>_>::end(&peVar3->vertices);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<FBX::Vector3_*,_std::vector<FBX::Vector3,_std::allocator<FBX::Vector3>_>_>
                             *)&vertex), bVar1) {
    pVVar4 = __gnu_cxx::
             __normal_iterator<FBX::Vector3_*,_std::vector<FBX::Vector3,_std::allocator<FBX::Vector3>_>_>
             ::operator*(&__end1_1);
    pVVar4->x = pVVar4->x;
    pVVar4->y = pVVar4->y;
    pVVar4->z = pVVar4->z;
    __gnu_cxx::
    __normal_iterator<FBX::Vector3_*,_std::vector<FBX::Vector3,_std::allocator<FBX::Vector3>_>_>::
    operator++(&__end1_1);
  }
  sVar5.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<FBX::Mesh>)sVar5.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Mesh> Parser::parseMesh(const Node &node, const Vector3 up) const {
        std::shared_ptr<Mesh> mesh(new Mesh(node));

        for (const auto &process : processes)
            process->execute(mesh);

        for (auto &vertex : mesh->vertices) {
            Vector3 v = vertex;

            // TODO
            /*if (processes & MAKE_X_UP) {
                if (up == 1)
                    v = Vector3(vertex.y, vertex.x, vertex.z);
                else if (up == 2)
                    v = Vector3(vertex.z, vertex.y, vertex.x);
            } else if (processes & MAKE_Y_UP) {
                if (up == 0)
                    v = Vector3(vertex.y, vertex.x, vertex.z);
                else if (up == 2)
                    v = Vector3(vertex.x, vertex.z, vertex.y);
            } else if (processes & MAKE_Z_UP) {
                if (up == 0)
                    v = Vector3(vertex.z, vertex.y, vertex.x);
                else if (up == 1)
                    v = Vector3(vertex.x, vertex.z, vertex.y);
            }*/

            vertex = v;
        }

        return mesh;
    }